

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# create_sequence_info.cpp
# Opt level: O2

void __thiscall duckdb::CreateSequenceInfo::CreateSequenceInfo(CreateSequenceInfo *this)

{
  allocator local_52;
  allocator local_51;
  string local_50;
  string local_30;
  
  ::std::__cxx11::string::string((string *)&local_30,anon_var_dwarf_4b4b1b2 + 9,&local_51);
  ::std::__cxx11::string::string((string *)&local_50,anon_var_dwarf_4b4b1b2 + 9,&local_52);
  CreateInfo::CreateInfo(&this->super_CreateInfo,SEQUENCE_ENTRY,&local_30,&local_50);
  ::std::__cxx11::string::~string((string *)&local_50);
  ::std::__cxx11::string::~string((string *)&local_30);
  (this->super_CreateInfo).super_ParseInfo._vptr_ParseInfo =
       (_func_int **)&PTR__CreateSequenceInfo_027b01c0;
  (this->name)._M_dataplus._M_p = (pointer)&(this->name).field_2;
  (this->name)._M_string_length = 0;
  (this->name).field_2._M_local_buf[0] = '\0';
  this->usage_count = 0;
  this->increment = 1;
  this->min_value = 1;
  this->max_value = 0x7fffffffffffffff;
  this->start_value = 1;
  this->cycle = false;
  return;
}

Assistant:

CreateSequenceInfo::CreateSequenceInfo()
    : CreateInfo(CatalogType::SEQUENCE_ENTRY, INVALID_SCHEMA), name(string()), usage_count(0), increment(1),
      min_value(1), max_value(NumericLimits<int64_t>::Maximum()), start_value(1), cycle(false) {
}